

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

ON_Quaternion * ON_Quaternion::Log(ON_Quaternion q)

{
  ON_Quaternion *in_RDI;
  double dVar1;
  double in_stack_00000008;
  double local_40;
  double z;
  double v;
  double lenq;
  
  dVar1 = Length((ON_Quaternion *)&stack0x00000008);
  z = ON_3dVector::Length((ON_3dVector *)&q);
  if (z <= 2.2250738585072014e-308) {
    z = 0.0;
  }
  if (z <= 0.0) {
    local_40 = 0.0;
  }
  else {
    local_40 = acos(in_stack_00000008 / dVar1);
    local_40 = local_40 / z;
  }
  dVar1 = log(dVar1);
  ON_Quaternion(in_RDI,dVar1,local_40 * q.a,local_40 * q.b,local_40 * q.c);
  return in_RDI;
}

Assistant:

ON_Quaternion ON_Quaternion::Log(ON_Quaternion q)
{
  // Added 8 Jan 2010 - not tested yet
  double lenq = q.Length();
  double v = ((const ON_3dVector*)&q.b)->Length();
  if ( !(v > ON_DBL_MIN) )
    v = 0.0;
  double z = (v > 0.0) ? acos(q.a/lenq)/v : 0.0;
  return ON_Quaternion(log(lenq), z*q.b, z*q.c, z*q.d );
}